

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          ParticleBelief *this,int num)

{
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_38;
  
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_38,&this->particles_);
  Sample(__return_storage_ptr__,num,&local_38,(this->super_Belief).model_);
  if (local_38.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num) const {
	return Sample(num, particles_, model_);
}